

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expected.hpp
# Opt level: O0

void __thiscall
nonstd::expected_lite::bad_expected_access<char>::bad_expected_access
          (bad_expected_access<char> *this,bad_expected_access<char> *param_1)

{
  bad_expected_access<char> *param_1_local;
  bad_expected_access<char> *this_local;
  
  bad_expected_access<void>::bad_expected_access
            (&this->super_bad_expected_access<void>,&param_1->super_bad_expected_access<void>);
  this->super_bad_expected_access<void> =
       (bad_expected_access<void>)&PTR__bad_expected_access_0022aca8;
  this->m_error = param_1->m_error;
  return;
}

Assistant:

class nsel_NODISCARD bad_expected_access : public bad_expected_access< void >
{
public:
    using error_type = E;

    explicit bad_expected_access( error_type error )
    : m_error( error )
    {}

    virtual char const * what() const noexcept override
    {
        return "bad_expected_access";
    }

    nsel_constexpr14 error_type & error() &
    {
        return m_error;
    }

    constexpr error_type const & error() const &
    {
        return m_error;
    }

#if !nsel_COMPILER_GNUC_VERSION || nsel_COMPILER_GNUC_VERSION >= 490

    nsel_constexpr14 error_type && error() &&
    {
        return std::move( m_error );
    }

    constexpr error_type const && error() const &&
    {
        return std::move( m_error );
    }

#endif

private:
    error_type m_error;
}